

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O1

void Wln_RetPrintObj(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  Wln_Ntk_t *pWVar5;
  Wln_Vec_t *pWVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  if (-1 < iObj) {
    uVar4 = (ulong)(uint)iObj;
    pWVar5 = p->pNtk;
    if (iObj < (pWVar5->vTypes).nSize) {
      switch((pWVar5->vTypes).pArray[uVar4]) {
      case 0:
      case 99:
        pcVar7 = (char *)0x0;
        break;
      case 1:
        pcVar7 = "pi";
        break;
      case 2:
        pcVar7 = "po";
        break;
      case 3:
        pcVar7 = "ci";
        break;
      case 4:
        pcVar7 = "co";
        break;
      case 5:
        pcVar7 = "fon";
        break;
      case 6:
        pcVar7 = "box";
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/abcOper.h"
                      ,0xe7,"const char *Abc_OperName(int)");
      case 0xb:
        pcVar7 = "buf";
        break;
      case 0xc:
        pcVar7 = "~";
        break;
      case 0xd:
      case 0x1e:
        pcVar7 = "&";
        break;
      case 0xe:
      case 0x1f:
        pcVar7 = "~&";
        break;
      case 0xf:
      case 0x20:
        pcVar7 = "|";
        break;
      case 0x10:
      case 0x21:
        pcVar7 = "~|";
        break;
      case 0x11:
      case 0x22:
        pcVar7 = "^";
        break;
      case 0x12:
      case 0x23:
        pcVar7 = "~^";
        break;
      case 0x15:
        pcVar7 = "mux";
        break;
      case 0x16:
        pcVar7 = "maj";
        break;
      case 0x24:
        pcVar7 = "!";
        break;
      case 0x25:
        pcVar7 = "&&";
        break;
      case 0x27:
        pcVar7 = "||";
        break;
      case 0x29:
        pcVar7 = "^^";
        break;
      case 0x32:
        pcVar7 = "+";
        break;
      case 0x33:
      case 0x3a:
        pcVar7 = "-";
        break;
      case 0x34:
      case 0x35:
        pcVar7 = "*";
        break;
      case 0x36:
        pcVar7 = "/";
        break;
      case 0x37:
        pcVar7 = "mod";
        break;
      case 0x38:
        pcVar7 = "%";
        break;
      case 0x39:
        pcVar7 = "**";
        break;
      case 0x3b:
        pcVar7 = "sqrt";
        break;
      case 0x3e:
        pcVar7 = "<";
        break;
      case 0x3f:
        pcVar7 = "<=";
        break;
      case 0x40:
        pcVar7 = ">=";
        break;
      case 0x41:
        pcVar7 = ">";
        break;
      case 0x42:
        pcVar7 = "==";
        break;
      case 0x43:
        pcVar7 = "!=";
        break;
      case 0x44:
        pcVar7 = "<<";
        break;
      case 0x45:
        pcVar7 = ">>";
        break;
      case 0x46:
        pcVar7 = "<<<";
        break;
      case 0x47:
        pcVar7 = ">>>";
        break;
      case 0x48:
        pcVar7 = "rotL";
        break;
      case 0x49:
        pcVar7 = "rotR";
        break;
      case 0x4b:
        pcVar7 = "lut";
        break;
      case 0x4d:
        pcVar7 = "table";
        break;
      case 0x59:
        pcVar7 = "DFFRSE";
        break;
      case 0x5b:
        pcVar7 = "[:]";
        break;
      case 0x5c:
        pcVar7 = "{}";
        break;
      case 0x5d:
        pcVar7 = "zPad";
        break;
      case 0x5e:
        pcVar7 = "sExt";
        break;
      case 0x5f:
        pcVar7 = "=>";
        break;
      case 0x60:
        pcVar7 = "squar";
        break;
      case 0x61:
        pcVar7 = "const";
      }
      if ((iObj < (pWVar5->vNameIds).nSize) && (iObj < (pWVar5->vInstIds).nSize)) {
        printf("Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ",uVar4,pcVar7,
               (ulong)(uint)(pWVar5->vNameIds).pArray[uVar4],
               (ulong)(uint)(pWVar5->vInstIds).pArray[uVar4],
               (ulong)(uint)pWVar5->vFanins[uVar4].nSize);
        pWVar5 = p->pNtk;
        pWVar6 = pWVar5->vFanins;
        if (0 < pWVar6[uVar4].nSize) {
          lVar11 = 0;
          do {
            iVar1 = (p->vFanins).nSize;
            if (iVar1 <= iObj) goto LAB_003626ad;
            piVar3 = (p->vFanins).pArray;
            lVar10 = (long)piVar3[uVar4];
            if ((lVar10 < 0) || (iVar1 <= piVar3[uVar4])) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            iVar1 = piVar3[lVar10 + lVar11 * 2];
            lVar8 = (long)iVar1;
            if (lVar8 != 0) {
              if (pWVar6[lVar8].nSize == 0) {
                if ((iVar1 < 0) || ((pWVar5->vTypes).nSize <= iVar1)) goto LAB_003626ad;
                if ((pWVar5->vTypes).pArray[lVar8] != 3) goto LAB_0036267d;
              }
              printf("%5d ");
              uVar2 = piVar3[lVar10 + lVar11 * 2 + 1];
              uVar9 = (ulong)uVar2;
              if (uVar9 != 0) {
                if ((((int)uVar2 < 0) || (iVar1 = (p->vEdgeLinks).nSize, iVar1 <= (int)uVar2)) ||
                   (iVar1 <= (int)(uVar2 + 1))) goto LAB_003626ad;
                piVar3 = (p->vEdgeLinks).pArray;
                printf("(%d : %d %d) ",uVar9,(ulong)(uint)piVar3[uVar9],
                       (ulong)(uint)piVar3[uVar2 + 1]);
              }
            }
LAB_0036267d:
            lVar11 = lVar11 + 1;
            pWVar5 = p->pNtk;
            pWVar6 = pWVar5->vFanins;
          } while (lVar11 < pWVar6[uVar4].nSize);
        }
        putchar(10);
        return;
      }
    }
  }
LAB_003626ad:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wln_RetPrintObj( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, Type = Wln_ObjType(p->pNtk, iObj), * pLink;
    printf( "Obj %6d : Type = %6s  NameId = %5d  InstId = %5d  Fanins = %d : ", 
        iObj, Abc_OperName(Type), Wln_ObjNameId(p->pNtk, iObj), Wln_ObjInstId(p->pNtk, iObj), Wln_ObjFaninNum(p->pNtk, iObj) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        printf( "%5d ", iFanin );
        if ( !pLink[0] )
            continue;
        printf( "(%d : %d %d) ", pLink[0], 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]), 
            Vec_IntEntry(&p->vEdgeLinks, pLink[0]+1) );
    }
    printf( "\n" );
}